

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>,_738093167U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<_15>,_Detail::M3<10>,_Detail::M3<_11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<_28>,_Detail::NoTempering>,_738093167U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint *p;
  uint state [25];
  uint *local_80;
  uint local_78 [26];
  
  lVar2 = 0;
  do {
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5 = (auVar4 | _DAT_0010a030) ^ _DAT_0010a040;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7fffffe7) {
      local_78[lVar2] = 1;
      local_78[lVar2 + 1] = 1;
    }
    auVar4 = (auVar4 | _DAT_0010a020) ^ _DAT_0010a040;
    if (auVar4._4_4_ == -0x80000000 && auVar4._0_4_ < -0x7fffffe7) {
      local_78[lVar2 + 2] = 1;
      local_78[lVar2 + 3] = 1;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x1c);
  local_80 = local_78;
  Well<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,Detail::M1,Detail::M3<-15>,Detail::M3<10>,Detail::M3<-11>,Detail::M3<16>,Detail::M2<20>,Detail::M1,Detail::M3<-28>,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,Detail::M1,Detail::M3<_15>,Detail::M3<10>,Detail::M3<_11>,Detail::M3<16>,Detail::M2<20>,Detail::M1,Detail::M3<_28>,Detail::NoTempering>
              *)this,&local_80,local_78 + 0x19);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }